

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInDescriptor
          (Generator *this,Descriptor *descriptor,Descriptor *containing_descriptor)

{
  int iVar1;
  int iVar2;
  Descriptor *pDVar3;
  FieldDescriptor *field;
  EnumDescriptor *descriptor_00;
  EnumDescriptor *enum_descriptor;
  int i_2;
  allocator<char> local_51;
  string local_50;
  FieldDescriptor *local_30;
  FieldDescriptor *field_descriptor;
  int i_1;
  int i;
  Descriptor *containing_descriptor_local;
  Descriptor *descriptor_local;
  Generator *this_local;
  
  field_descriptor._4_4_ = 0;
  _i_1 = containing_descriptor;
  containing_descriptor_local = descriptor;
  descriptor_local = (Descriptor *)this;
  while( true ) {
    iVar2 = field_descriptor._4_4_;
    iVar1 = Descriptor::nested_type_count(containing_descriptor_local);
    if (iVar1 <= iVar2) break;
    pDVar3 = Descriptor::nested_type(containing_descriptor_local,field_descriptor._4_4_);
    FixForeignFieldsInDescriptor(this,pDVar3,containing_descriptor_local);
    field_descriptor._4_4_ = field_descriptor._4_4_ + 1;
  }
  field_descriptor._0_4_ = 0;
  while( true ) {
    iVar2 = (int)field_descriptor;
    iVar1 = Descriptor::field_count(containing_descriptor_local);
    if (iVar1 <= iVar2) break;
    field = Descriptor::field(containing_descriptor_local,(int)field_descriptor);
    pDVar3 = containing_descriptor_local;
    local_30 = field;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"fields_by_name",&local_51);
    FixForeignFieldsInField(this,pDVar3,field,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    field_descriptor._0_4_ = (int)field_descriptor + 1;
  }
  FixContainingTypeInDescriptor<google::protobuf::Descriptor>(this,containing_descriptor_local,_i_1)
  ;
  enum_descriptor._0_4_ = 0;
  while( true ) {
    iVar2 = Descriptor::enum_type_count(containing_descriptor_local);
    if (iVar2 <= (int)enum_descriptor) break;
    descriptor_00 = Descriptor::enum_type(containing_descriptor_local,(int)enum_descriptor);
    FixContainingTypeInDescriptor<google::protobuf::EnumDescriptor>
              (this,descriptor_00,containing_descriptor_local);
    enum_descriptor._0_4_ = (int)enum_descriptor + 1;
  }
  return;
}

Assistant:

void Generator::FixForeignFieldsInDescriptor(
    const Descriptor& descriptor,
    const Descriptor* containing_descriptor) const {
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    FixForeignFieldsInDescriptor(*descriptor.nested_type(i), &descriptor);
  }

  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field_descriptor = *descriptor.field(i);
    FixForeignFieldsInField(&descriptor, field_descriptor, "fields_by_name");
  }

  FixContainingTypeInDescriptor(descriptor, containing_descriptor);
  for (int i = 0; i < descriptor.enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *descriptor.enum_type(i);
    FixContainingTypeInDescriptor(enum_descriptor, &descriptor);
  }
}